

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

_Bool Field_Grown(FIELD *field,int amount)

{
  int iVar1;
  FORM *form;
  char *__ptr;
  WINDOW_conflict *pWVar2;
  int iVar3;
  char *__ptr_00;
  WINDOW_conflict *pWVar4;
  FIELD *linked_field;
  FIELD *pFVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  char *__src;
  int iVar11;
  char *__dest;
  bool bVar12;
  
  if ((field != (FIELD *)0x0) && ((field->status & 8) != 0)) {
    form = field->form;
    if ((form == (FORM *)0x0) || ((form->status & 1) == 0)) {
      bVar12 = false;
    }
    else {
      bVar12 = form->current == field;
    }
    iVar1 = field->drows;
    iVar7 = field->dcols;
    iVar11 = (int)field->rows + field->nrow;
    __ptr = field->buf;
    if (bVar12) {
      Synchronize_Buffer(form);
    }
    if (iVar11 == 1) {
      iVar3 = field->cols * amount;
      iVar9 = field->maxgrow;
      if ((iVar9 != 0) && (iVar6 = iVar9 - field->dcols, iVar6 < iVar3)) {
        iVar3 = iVar6;
      }
      iVar3 = iVar3 + field->dcols;
      field->dcols = iVar3;
    }
    else {
      iVar3 = ((int)field->rows + field->nrow) * amount;
      iVar9 = field->maxgrow;
      if ((iVar9 != 0) && (iVar6 = iVar9 - field->drows, iVar6 < iVar3)) {
        iVar3 = iVar6;
      }
      iVar3 = iVar3 + field->drows;
      field->drows = iVar3;
    }
    if (iVar3 == iVar9) {
      *(byte *)&field->status = (byte)field->status & 0xf7;
    }
    lVar10 = (long)field->dcols * (long)field->drows;
    iVar9 = (int)lVar10;
    __ptr_00 = (char *)malloc(((long)field->nbuf + 1) * ((long)iVar9 + 1));
    if (__ptr_00 != (char *)0x0) {
      field->buf = __ptr_00;
      if (-1 < field->nbuf) {
        iVar3 = iVar7 * iVar1;
        lVar8 = -1;
        __src = __ptr;
        do {
          lVar8 = lVar8 + 1;
          __dest = field->buf + ((long)field->dcols * (long)field->drows + 1) * lVar8;
          memcpy(__dest,__src,(long)iVar3);
          if (iVar3 < iVar9) {
            memset(__dest + iVar3,0x20,(long)(iVar9 - iVar3));
          }
          __dest[lVar10] = '\0';
          __src = __src + (iVar3 + 1);
        } while (lVar8 < field->nbuf);
      }
      if (bVar12) {
        pWVar4 = (WINDOW_conflict *)newpad(field->drows,field->dcols);
        if (pWVar4 == (WINDOW_conflict *)0x0) {
          field->dcols = iVar7;
          field->drows = iVar1;
          field->buf = __ptr;
          if (iVar11 == 1) {
            iVar1 = iVar7;
          }
          if (iVar1 != field->maxgrow) {
            *(byte *)&field->status = (byte)field->status | 8;
          }
          free(__ptr_00);
        }
        else {
          if (form == (FORM *)0x0) {
            __assert_fail("form!=(FORM *)0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CursesDialog/form/frm_driver.c"
                          ,0x21a,"_Bool Field_Grown(FIELD *, int)");
          }
          delwin(form->w);
          form->w = pWVar4;
          wbkgdset(pWVar4,field->back | field->pad);
          wattrset(form->w,field->fore);
          werase(form->w);
          Buffer_To_Window(field,form->w);
          pWVar2 = form->w;
          if (pWVar2 == (WINDOW_conflict *)0x0) {
            iVar7 = -1;
          }
          else {
            iVar7 = pWVar2->_maxy + 1;
          }
          wtouchln(pWVar2,0,iVar7,0);
          wmove(form->w,form->currow,form->curcol);
        }
        if (pWVar4 == (WINDOW_conflict *)0x0) {
          return false;
        }
      }
      free(__ptr);
      for (pFVar5 = field->link; pFVar5 != field; pFVar5 = pFVar5->link) {
        pFVar5->buf = field->buf;
        pFVar5->drows = field->drows;
        pFVar5->dcols = field->dcols;
      }
      return true;
    }
    field->dcols = iVar7;
    field->drows = iVar1;
    if (iVar11 == 1) {
      iVar1 = iVar7;
    }
    if (iVar1 != field->maxgrow) {
      *(byte *)&field->status = (byte)field->status | 8;
    }
  }
  return false;
}

Assistant:

static bool Field_Grown(FIELD * field, int amount)
{
  bool result = FALSE;

  if (field && Growable(field))
    {
      bool single_line_field = Single_Line_Field(field);
      int old_buflen = Buffer_Length(field);
      int new_buflen;
      int old_dcols = field->dcols;
      int old_drows = field->drows;
      char *oldbuf  = field->buf;
      char *newbuf;

      int growth;
      FORM *form = field->form;
      bool need_visual_update = ((form != (FORM *)0)      &&
                                 (form->status & _POSTED) &&
                                 (form->current==field));
      
      if (need_visual_update)
        Synchronize_Buffer(form);
      
      if (single_line_field)
        {
          growth = field->cols * amount;
          if (field->maxgrow)
            growth = Minimum(field->maxgrow - field->dcols,growth);
          field->dcols += growth;
          if (field->dcols == field->maxgrow)
            field->status &= ~_MAY_GROW;
        }
      else
        {
          growth = (field->rows + field->nrow) * amount;
          if (field->maxgrow)
            growth = Minimum(field->maxgrow - field->drows,growth);
          field->drows += growth;
          if (field->drows == field->maxgrow)
            field->status &= ~_MAY_GROW;
        }
      /* drows, dcols changed, so we get really the new buffer length */
      new_buflen = Buffer_Length(field);
      newbuf=(char *)malloc((size_t)Total_Buffer_Size(field));
      if (!newbuf)
        { /* restore to previous state */
          field->dcols = old_dcols;
          field->drows = old_drows;
          if (( single_line_field && (field->dcols!=field->maxgrow)) ||
              (!single_line_field && (field->drows!=field->maxgrow)))
            field->status |= _MAY_GROW;
          return FALSE;
        }
      else
        { /* Copy all the buffers. This is the reason why we can't
             just use realloc().
             */
          int i;
          char *old_bp;
          char *new_bp;
          
          field->buf = newbuf;
          for(i=0;i<=field->nbuf;i++)
            {
              new_bp = Address_Of_Nth_Buffer(field,i);
              old_bp = oldbuf + i*(1+old_buflen);
              memcpy(new_bp,old_bp,(size_t)old_buflen);
              if (new_buflen > old_buflen)
                memset(new_bp + old_buflen,C_BLANK,
                       (size_t)(new_buflen - old_buflen));
              *(new_bp + new_buflen) = '\0';
            }

          if (need_visual_update)
            {         
              WINDOW *new_window = newpad(field->drows,field->dcols);
              if (!new_window)
                { /* restore old state */
                  field->dcols = old_dcols;
                  field->drows = old_drows;
                  field->buf   = oldbuf;
                  if (( single_line_field              && 
                        (field->dcols!=field->maxgrow)) ||
                      (!single_line_field              && 
                       (field->drows!=field->maxgrow)))
                    field->status |= _MAY_GROW;
                  free( newbuf );
                  return FALSE;
                }
              assert(form!=(FORM *)0);
              delwin(form->w);
              form->w = new_window;
              Set_Field_Window_Attributes(field,form->w);
              werase(form->w);
              Buffer_To_Window(field,form->w);
              untouchwin(form->w);
              wmove(form->w,form->currow,form->curcol);
            }

          free(oldbuf);
          /* reflect changes in linked fields */
          if (field != field->link)
            {
              FIELD *linked_field;
              for(linked_field = field->link;
                  linked_field!= field;
                  linked_field = linked_field->link)
                {
                  linked_field->buf   = field->buf;
                  linked_field->drows = field->drows;
                  linked_field->dcols = field->dcols;
                }
            }
          result = TRUE;
        }       
    }
  return(result);
}